

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O2

int prvTidyinitStdIOFileSource(TidyAllocator *allocator,TidyInputSource *inp,FILE *fp)

{
  int iVar1;
  undefined8 *puVar2;
  
  puVar2 = (undefined8 *)(*allocator->vtbl->alloc)(allocator,0x28);
  if (puVar2 == (undefined8 *)0x0) {
    iVar1 = -1;
  }
  else {
    puVar2[4] = 0;
    puVar2[2] = 0;
    puVar2[3] = 0;
    puVar2[1] = allocator;
    *puVar2 = fp;
    inp->getByte = filesrc_getByte;
    inp->eof = filesrc_eof;
    inp->ungetByte = filesrc_ungetByte;
    inp->sourceData = puVar2;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int TY_(initFileSource)( TidyAllocator *allocator, TidyInputSource* inp, FILE* fp )
{
  FileSource* fin = NULL;

  fin = (FileSource*) TidyAlloc( allocator, sizeof(FileSource) );
  if ( !fin )
      return -1;
  TidyClearMemory( fin, sizeof(FileSource) );
  fin->unget.allocator = allocator;
  fin->fp = fp;

  inp->getByte    = filesrc_getByte;
  inp->eof        = filesrc_eof;
  inp->ungetByte  = filesrc_ungetByte;
  inp->sourceData = fin;

  return 0;
}